

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManCutMatchOne(Nf_Man_t *p,int iObj,int *pCut,int *pCutSet)

{
  Nf_Mat_t (*paNVar1) [2];
  uint uVar2;
  uint uVar3;
  int iVar4;
  Nf_Obj_t *pNVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  Mio_Cell2_t *pMVar8;
  word wVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  Nf_Mat_t *pNVar22;
  uint uVar23;
  word wVar24;
  uint *puVar25;
  bool bVar26;
  long lVar27;
  Nf_Obj_t *pBestF [6];
  long alStack_68 [7];
  
  uVar2 = *pCut;
  if (p->vTt2Match->nSize <= (int)(uVar2 >> 6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar18 = uVar2 & 0x1f;
  if (uVar18 != 0) {
    pNVar5 = p->pNfObjs;
    uVar23 = (uVar2 >> 6) << 4;
    pVVar6 = p->vTt2Match->pArray;
    uVar14 = 0;
    do {
      alStack_68[uVar14] = (long)(pNVar5 + pCut[uVar14 + 1]);
      uVar14 = uVar14 + 1;
    } while (uVar18 != uVar14);
    if (uVar18 != 0) {
      if (*(int *)((long)&pVVar6->nSize + (ulong)uVar23) < 2) {
        return;
      }
      if (iObj < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      uVar12 = ((int)pCut - (int)pCutSet & 0xffcU) << 0x12;
      lVar21 = 0;
      do {
        lVar7 = *(long *)((long)&pVVar6->pArray + (ulong)uVar23);
        uVar3 = *(uint *)(lVar7 + 4 + lVar21 * 4);
        uVar13 = (uVar3 ^ uVar2 >> 5) & 1;
        uVar20 = uVar13 | iObj * 2;
        if ((p->vRequired).nSize <= (int)uVar20) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        iVar4 = *(int *)(lVar7 + lVar21 * 4);
        pMVar8 = p->pCells;
        if (uVar18 != *(uint *)&pMVar8[iVar4].field_0x10 >> 0x1c) {
          __assert_fail("nFans == (int)pC->nFanins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x479,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
        }
        uVar14 = (p->vRequired).pArray[uVar20];
        puVar25 = (uint *)(&pNVar5[iObj].M[0][0].field_0x0 + uVar13 * 0x30);
        wVar24 = pMVar8[iVar4].Area;
        bVar17 = 0;
        uVar19 = 0;
        uVar15 = 0;
        do {
          lVar7 = alStack_68[(uVar3 >> 8) >> (bVar17 & 0x1f) & 0xf];
          uVar13 = (uint)(((uVar3 >> 1 & 0x7f) >> ((uint)uVar19 & 0x1f) & 1) != 0);
          uVar16 = (ulong)(uVar13 * 0x30);
          wVar9 = pMVar8[iVar4].Delays[uVar19];
          lVar10 = *(long *)(lVar7 + 8 + uVar16);
          if (uVar14 == 0xffffffffffffffff) {
LAB_006fc193:
            if ((*(long *)(puVar25 + 2) == -1) ||
               (uVar16 = wVar9 + lVar10, *(long *)(puVar25 + 8) == -1)) {
              uVar16 = wVar9 + lVar10;
              lVar27 = 0;
            }
            else {
              lVar27 = 0;
              if (uVar14 < uVar16) goto LAB_006fc2a8;
            }
          }
          else {
            uVar16 = *(long *)(lVar7 + 0x20 + uVar16) + wVar9;
            lVar27 = 1;
            if (uVar14 < uVar16) goto LAB_006fc193;
          }
          if (uVar16 < uVar15) {
            uVar16 = uVar15;
          }
          wVar24 = wVar24 + *(long *)(lVar7 + (ulong)(uVar13 * 0x30) + 0x10 + lVar27 * 0x18);
          uVar19 = uVar19 + 1;
          bVar17 = bVar17 + 4;
          uVar15 = uVar16;
        } while (uVar18 != uVar19);
        if (uVar16 < *(ulong *)(puVar25 + 2)) {
          *(ulong *)(puVar25 + 2) = uVar16;
          *(word *)(puVar25 + 4) = wVar24;
          if (pCut <= pCutSet) goto LAB_006fc39a;
          uVar13 = *puVar25;
          *puVar25 = uVar13 & 0xc00fffff | uVar12;
          *puVar25 = uVar13 & 0xc0000000 | uVar12 | *(uint *)&pMVar8[iVar4].field_0x10 & 0xfffff;
          puVar25[1] = uVar3 & 0xfffffffe;
          if (wVar24 < *(ulong *)(puVar25 + 10)) {
            *(ulong *)(puVar25 + 8) = uVar16;
            *(word *)(puVar25 + 10) = wVar24;
LAB_006fc272:
            uVar13 = puVar25[6];
            puVar25[6] = uVar13 & 0xc00fffff | uVar12;
            puVar25[6] = uVar13 & 0xc0000000 | uVar12 | *(uint *)&pMVar8[iVar4].field_0x10 & 0xfffff
            ;
            puVar25[7] = uVar3 & 0xfffffffe;
          }
        }
        else if (wVar24 < *(ulong *)(puVar25 + 10)) {
          *(ulong *)(puVar25 + 8) = uVar16;
          *(word *)(puVar25 + 10) = wVar24;
          if (pCutSet < pCut) goto LAB_006fc272;
          goto LAB_006fc39a;
        }
LAB_006fc2a8:
        lVar21 = lVar21 + 2;
        if (*(int *)((long)&pVVar6->nSize + (ulong)uVar23) <= (int)((uint)lVar21 | 1)) {
          return;
        }
      } while( true );
    }
  }
  if (0x3f < uVar2) {
    __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x461,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
  }
  uVar18 = ((int)pCut - (int)pCutSet & 0xffcU) << 0x12;
  lVar21 = 0;
  bVar26 = true;
  while( true ) {
    pNVar5 = p->pNfObjs;
    uVar23 = (uint)lVar21 ^ (uint)(uVar2 >> 5 == 1);
    pNVar5[iObj].M[lVar21][1].D = 0;
    pNVar5[iObj].M[lVar21][0].D = 0;
    wVar24 = p->pCells[uVar23].Area;
    pNVar5[iObj].M[lVar21][1].A = wVar24;
    pNVar5[iObj].M[lVar21][0].A = wVar24;
    if (pCut <= pCutSet) break;
    paNVar1 = pNVar5[iObj].M + lVar21;
    pNVar22 = pNVar5[iObj].M[lVar21] + 1;
    uVar12 = *(uint *)*paNVar1;
    *(uint *)pNVar22 = *(uint *)pNVar22 & 0xc0000000 | uVar18 | uVar23;
    *(uint *)*paNVar1 = uVar12 & 0xc0000000 | uVar18 | uVar23;
    pNVar5[iObj].M[lVar21][1].Cfg = (Nf_Cfg_t)0x0;
    (*paNVar1)[0].Cfg = (Nf_Cfg_t)0x0;
    lVar21 = 1;
    bVar11 = !bVar26;
    bVar26 = false;
    if (bVar11) {
      return;
    }
  }
LAB_006fc39a:
  __assert_fail("pCut > pCutSet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                ,0x95,"int Nf_CutHandle(int *, int *)");
}

Assistant:

void Nf_ManCutMatchOne( Nf_Man_t * p, int iObj, int * pCut, int * pCutSet )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, c, Info, Offset, iFanin, fComplF;
    word ArrivalD, ArrivalA;
    Nf_Mat_t * pD, * pA;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        assert( iFuncLit == 0 || iFuncLit == 1 );
        for ( c = 0; c < 2; c++ )
        { 
            pD = Nf_ObjMatchD( p, iObj, c );
            pA = Nf_ObjMatchA( p, iObj, c );
            pD->D = pA->D = 0;
            pD->A = pA->A = p->pCells[c ^ Const].Area;
            pD->CutH = pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pA->Gate = c ^ Const;
//            pD->Conf = pA->Conf = 0;
            pD->Cfg = pA->Cfg = Nf_Int2Cfg(0);
        }
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        word Required  = Nf_ObjRequired( p, iObj, fCompl );
        Nf_Mat_t * pD  = &pBest->M[fCompl][0];
        Nf_Mat_t * pA  = &pBest->M[fCompl][1];
        word Area      = pC->Area, Delay = 0;
        assert( nFans == (int)pC->nFanins );
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            ArrivalD  = pBestF[iFanin]->M[fComplF][0].D;
            ArrivalA  = pBestF[iFanin]->M[fComplF][1].D;
            if ( ArrivalA + pC->Delays[k] <= Required && Required != NF_INFINITY )
            {
                Delay = Abc_MaxWord( Delay, ArrivalA + pC->Delays[k] );
                Area += pBestF[iFanin]->M[fComplF][1].A;
            }
            else 
            {
                if ( pD->D < NF_INFINITY && pA->D < NF_INFINITY && ArrivalD + pC->Delays[k] > Required )
                    break;
                Delay = Abc_MaxWord( Delay, ArrivalD + pC->Delays[k] );
                Area += pBestF[iFanin]->M[fComplF][0].A;
            }
        }
        if ( k < nFans )
            continue;
        // select best Cfgch
        if ( pD->D > Delay )
        {
            pD->D = Delay;
            pD->A = Area;
            pD->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pC->Id;
            pD->Cfg = Cfg;
            pD->Cfg.fCompl = 0;
        }

        if ( pA->A > Area )
        {
            pA->D = Delay;
            pA->A = Area;
            pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pA->Gate = pC->Id;
            pA->Cfg = Cfg;
            pA->Cfg.fCompl = 0;
        }
    }
}